

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::SynchronizationTests::init(SynchronizationTests *this,EVP_PKEY_CTX *ctx)

{
  StorageType SVar1;
  int iVar2;
  Context *pCVar3;
  TestNode *pTVar4;
  TestCaseGroup *pTVar5;
  TestNode *pTVar6;
  char *pcVar7;
  char *pcVar8;
  InvocationAliasWriteCase *pIVar9;
  ulong extraout_RAX;
  InterCallTestCase *pIVar10;
  InterCallOperations *pIVar11;
  ulong uVar12;
  SSBOConcurrentAtomicCase *this_00;
  ConcurrentImageAtomicCase *this_01;
  ConcurrentAtomicCounterCase *this_02;
  ConcurrentSSBOAtomicCounterMixedCase *this_03;
  ReadMultipleData RVar13;
  WriteDataInterleaved WVar14;
  ReadDataInterleaved RVar15;
  TestNode *local_e28;
  string local_df8;
  allocator<char> local_dd1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_dd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_db0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d50;
  int local_d2c;
  uint local_d28;
  int callCountNdx_3;
  int invocationNdx_3;
  allocator<char> local_cf9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c78;
  int local_c54;
  uint local_c50;
  int callCountNdx_2;
  int invocationNdx_2;
  allocator<char> local_c21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_be0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ba0;
  int local_b7c;
  uint local_b78;
  int callCountNdx_1;
  int invocationNdx_1;
  allocator<char> local_b49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ae8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ac8;
  int local_aa8;
  uint local_aa4;
  int callCountNdx;
  int invocationNdx;
  ReadData local_a94;
  Barrier local_a89;
  WriteData local_a88;
  WriteData local_a80;
  InterCallOperations local_a78;
  allocator<char> local_a59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a18;
  allocator<char> local_9f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9d0;
  undefined1 local_9ad;
  ReadData local_9ac;
  ReadData local_9a4;
  Barrier local_999;
  WriteData local_998;
  WriteData local_990;
  InterCallOperations local_988;
  allocator<char> local_969;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_968;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_948;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_928;
  allocator<char> local_901;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_900;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8e0;
  undefined1 local_8b9;
  ReadDataInterleaved local_8b8;
  ReadDataInterleaved local_8a8;
  Barrier local_899;
  WriteDataInterleaved local_898;
  WriteDataInterleaved local_888;
  WriteDataInterleaved local_878;
  WriteDataInterleaved local_868;
  InterCallOperations local_858;
  allocator<char> local_839;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_838;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_818;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f8;
  allocator<char> local_7d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7b0;
  undefined1 local_78d;
  ReadMultipleData local_78c;
  Barrier local_779;
  WriteData local_778;
  WriteData local_770;
  InterCallOperations local_768;
  allocator<char> local_749;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_748;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_728;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_708;
  allocator<char> local_6e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c0;
  undefined1 local_699;
  ReadData local_698;
  Barrier local_68d;
  WriteData local_68c;
  Barrier local_681;
  WriteData local_680;
  InterCallOperations local_678;
  allocator<char> local_659;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_658;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_638;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_618;
  allocator<char> local_5f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d0;
  undefined1 local_5a9;
  WriteData local_5a8;
  Barrier local_59d;
  ReadZeroData local_59c;
  InterCallOperations local_598;
  allocator<char> local_579;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_578;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  allocator<char> local_511;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  undefined1 local_4cd;
  ReadData local_4cc;
  Barrier local_4c1;
  WriteData local_4c0;
  InterCallOperations local_4b8;
  allocator<char> local_499;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  allocator<char> local_431;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  char *local_3f0;
  char *target_1;
  undefined4 local_3e0;
  int configNdx_1;
  int seed1;
  int seed0;
  TestCaseGroup *withoutBarrierGroup;
  TestCaseGroup *withBarrierGroup;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  allocator<char> local_359;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  undefined1 local_312;
  allocator<char> local_311;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  allocator<char> local_2a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  undefined1 local_262;
  allocator<char> local_261;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  allocator<char> local_1f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  undefined1 local_1b2;
  allocator<char> local_1b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  allocator<char> local_149;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  undefined1 local_102;
  allocator<char> local_101;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  allocator<char> local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  char *local_58;
  char *target;
  int configNdx;
  int extraFlags;
  TestCaseGroup *targetGroup;
  TestNode *pTStack_38;
  int groupNdx;
  TestCaseGroup *interCallGroup;
  TestCaseGroup *interInvocationGroup;
  TestNode *local_18;
  TestCaseGroup *inInvocationGroup;
  SynchronizationTests *this_local;
  
  inInvocationGroup = (TestCaseGroup *)this;
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "in_invocation","Test intra-invocation synchronization");
  local_18 = pTVar4;
  pTVar5 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar5,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "inter_invocation","Test inter-invocation synchronization");
  interCallGroup = pTVar5;
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"inter_call",
             "Test inter-call synchronization");
  pTStack_38 = pTVar4;
  tcu::TestNode::addChild((TestNode *)this,local_18);
  tcu::TestNode::addChild((TestNode *)this,&interCallGroup->super_TestNode);
  tcu::TestNode::addChild((TestNode *)this,pTStack_38);
  for (targetGroup._4_4_ = 0; targetGroup._4_4_ < 2; targetGroup._4_4_ = targetGroup._4_4_ + 1) {
    if (targetGroup._4_4_ == 0) {
      local_e28 = local_18;
    }
    else {
      local_e28 = &interCallGroup->super_TestNode;
    }
    _configNdx = local_e28;
    target._4_4_ = 4;
    if (targetGroup._4_4_ == 0) {
      target._4_4_ = 0;
    }
    for (target._0_4_ = 0; pTVar4 = _configNdx, (int)target < 4; target._0_4_ = (int)target + 1) {
      local_58 = "image";
      if (init::configs[(int)target].storage == STORAGE_BUFFER) {
        local_58 = "buffer";
      }
      pTVar6 = (TestNode *)operator_new(0xa8);
      local_102 = 1;
      pCVar3 = (this->super_TestCaseGroup).m_context;
      pcVar7 = init::configs[(int)target].namePrefix;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,pcVar7,&local_99);
      std::operator+(&local_78,&local_98,"_write_read");
      pcVar7 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_100,"Write to ",&local_101);
      std::operator+(&local_e0,&local_100,local_58);
      std::operator+(&local_c0,&local_e0," and read it");
      pcVar8 = (char *)std::__cxx11::string::c_str();
      anon_unknown_1::InvocationWriteReadCase::InvocationWriteReadCase
                ((InvocationWriteReadCase *)pTVar6,pCVar3,pcVar7,pcVar8,
                 init::configs[(int)target].storage,init::configs[(int)target].flags | target._4_4_)
      ;
      local_102 = 0;
      tcu::TestNode::addChild(pTVar4,pTVar6);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
      std::allocator<char>::~allocator(&local_101);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_98);
      std::allocator<char>::~allocator(&local_99);
      pTVar4 = _configNdx;
      pTVar6 = (TestNode *)operator_new(0xa8);
      local_1b2 = 1;
      pCVar3 = (this->super_TestCaseGroup).m_context;
      pcVar7 = init::configs[(int)target].namePrefix;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,pcVar7,&local_149);
      std::operator+(&local_128,&local_148,"_read_write");
      pcVar7 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1b0,"Read form ",&local_1b1);
      std::operator+(&local_190,&local_1b0,local_58);
      std::operator+(&local_170,&local_190," and then write to it");
      pcVar8 = (char *)std::__cxx11::string::c_str();
      anon_unknown_1::InvocationReadWriteCase::InvocationReadWriteCase
                ((InvocationReadWriteCase *)pTVar6,pCVar3,pcVar7,pcVar8,
                 init::configs[(int)target].storage,init::configs[(int)target].flags | target._4_4_)
      ;
      local_1b2 = 0;
      tcu::TestNode::addChild(pTVar4,pTVar6);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::allocator<char>::~allocator(&local_1b1);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_148);
      std::allocator<char>::~allocator(&local_149);
      pTVar4 = _configNdx;
      pTVar6 = (TestNode *)operator_new(0xa8);
      local_262 = 1;
      pCVar3 = (this->super_TestCaseGroup).m_context;
      pcVar7 = init::configs[(int)target].namePrefix;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,pcVar7,&local_1f9);
      std::operator+(&local_1d8,&local_1f8,"_overwrite");
      pcVar7 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_260,"Write to ",&local_261);
      std::operator+(&local_240,&local_260,local_58);
      std::operator+(&local_220,&local_240," twice and read it");
      pcVar8 = (char *)std::__cxx11::string::c_str();
      anon_unknown_1::InvocationOverWriteCase::InvocationOverWriteCase
                ((InvocationOverWriteCase *)pTVar6,pCVar3,pcVar7,pcVar8,
                 init::configs[(int)target].storage,init::configs[(int)target].flags | target._4_4_)
      ;
      local_262 = 0;
      tcu::TestNode::addChild(pTVar4,pTVar6);
      std::__cxx11::string::~string((string *)&local_220);
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)&local_260);
      std::allocator<char>::~allocator(&local_261);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::allocator<char>::~allocator(&local_1f9);
      pTVar4 = _configNdx;
      pIVar9 = (InvocationAliasWriteCase *)operator_new(0xb0);
      local_312 = 1;
      pCVar3 = (this->super_TestCaseGroup).m_context;
      pcVar7 = init::configs[(int)target].namePrefix;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,pcVar7,&local_2a9);
      std::operator+(&local_288,&local_2a8,"_alias_write");
      pcVar7 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_310,"Write to aliasing ",&local_311);
      std::operator+(&local_2f0,&local_310,local_58);
      std::operator+(&local_2d0,&local_2f0," and read it");
      pcVar8 = (char *)std::__cxx11::string::c_str();
      anon_unknown_1::InvocationAliasWriteCase::InvocationAliasWriteCase
                (pIVar9,pCVar3,pcVar7,pcVar8,TYPE_WRITE,init::configs[(int)target].storage,
                 init::configs[(int)target].flags | target._4_4_);
      local_312 = 0;
      tcu::TestNode::addChild(pTVar4,(TestNode *)pIVar9);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_310);
      std::allocator<char>::~allocator(&local_311);
      std::__cxx11::string::~string((string *)&local_288);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::allocator<char>::~allocator(&local_2a9);
      pTVar4 = _configNdx;
      pIVar9 = (InvocationAliasWriteCase *)operator_new(0xb0);
      withBarrierGroup._6_1_ = 1;
      pCVar3 = (this->super_TestCaseGroup).m_context;
      pcVar7 = init::configs[(int)target].namePrefix;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_358,pcVar7,&local_359);
      std::operator+(&local_338,&local_358,"_alias_overwrite");
      pcVar7 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3c0,"Write to aliasing ",
                 (allocator<char> *)((long)&withBarrierGroup + 7));
      std::operator+(&local_3a0,&local_3c0,local_58);
      std::operator+(&local_380,&local_3a0,"s and read it");
      pcVar8 = (char *)std::__cxx11::string::c_str();
      anon_unknown_1::InvocationAliasWriteCase::InvocationAliasWriteCase
                (pIVar9,pCVar3,pcVar7,pcVar8,TYPE_OVERWRITE,init::configs[(int)target].storage,
                 init::configs[(int)target].flags | target._4_4_);
      withBarrierGroup._6_1_ = 0;
      tcu::TestNode::addChild(pTVar4,(TestNode *)pIVar9);
      std::__cxx11::string::~string((string *)&local_380);
      std::__cxx11::string::~string((string *)&local_3a0);
      std::__cxx11::string::~string((string *)&local_3c0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&withBarrierGroup + 7));
      std::__cxx11::string::~string((string *)&local_338);
      std::__cxx11::string::~string((string *)&local_358);
      std::allocator<char>::~allocator(&local_359);
    }
  }
  pTVar5 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar5,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "with_memory_barrier","Synchronize with memory barrier");
  withoutBarrierGroup = pTVar5;
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "without_memory_barrier","Synchronize without memory barrier");
  _seed1 = pTVar4;
  tcu::TestNode::addChild(pTStack_38,&withoutBarrierGroup->super_TestNode);
  tcu::TestNode::addChild(pTStack_38,_seed1);
  configNdx_1 = 0x7b;
  local_3e0 = 0x1c9;
  target_1._4_4_ = 0;
  uVar12 = extraout_RAX;
  while (pTVar5 = withoutBarrierGroup, (int)target_1._4_4_ < 4) {
    local_3f0 = "image";
    if (init()::configs[(int)target_1._4_4_].storage == STORAGE_BUFFER) {
      local_3f0 = "buffer";
    }
    pIVar10 = (InterCallTestCase *)operator_new(0x108);
    local_4cd = 1;
    pCVar3 = (this->super_TestCaseGroup).m_context;
    pcVar7 = init()::configs[(int)target_1._4_4_].namePrefix;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_430,pcVar7,&local_431);
    std::operator+(&local_410,&local_430,"_write_read");
    pcVar7 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_498,"Write to ",&local_499);
    std::operator+(&local_478,&local_498,local_3f0);
    std::operator+(&local_458,&local_478," and read it");
    pcVar8 = (char *)std::__cxx11::string::c_str();
    SVar1 = init()::configs[(int)target_1._4_4_].storage;
    iVar2 = init()::configs[(int)target_1._4_4_].flags;
    local_4b8.m_cmds.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_4b8.m_cmds.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_4b8.m_cmds.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    anon_unknown_1::InterCallOperations::InterCallOperations(&local_4b8);
    local_4c0 = anon_unknown_1::op::WriteData::Generate(1,0x7b);
    pIVar11 = anon_unknown_1::InterCallOperations::operator<<(&local_4b8,&local_4c0);
    pIVar11 = anon_unknown_1::InterCallOperations::operator<<(pIVar11,&local_4c1);
    local_4cc = anon_unknown_1::op::ReadData::Generate(1,0x7b);
    pIVar11 = anon_unknown_1::InterCallOperations::operator<<(pIVar11,&local_4cc);
    anon_unknown_1::InterCallTestCase::InterCallTestCase
              (pIVar10,pCVar3,pcVar7,pcVar8,SVar1,iVar2,pIVar11);
    local_4cd = 0;
    tcu::TestNode::addChild(&pTVar5->super_TestNode,(TestNode *)pIVar10);
    anon_unknown_1::InterCallOperations::~InterCallOperations(&local_4b8);
    std::__cxx11::string::~string((string *)&local_458);
    std::__cxx11::string::~string((string *)&local_478);
    std::__cxx11::string::~string((string *)&local_498);
    std::allocator<char>::~allocator(&local_499);
    std::__cxx11::string::~string((string *)&local_410);
    std::__cxx11::string::~string((string *)&local_430);
    std::allocator<char>::~allocator(&local_431);
    pTVar5 = withoutBarrierGroup;
    pIVar10 = (InterCallTestCase *)operator_new(0x108);
    local_5a9 = 1;
    pCVar3 = (this->super_TestCaseGroup).m_context;
    pcVar7 = init()::configs[(int)target_1._4_4_].namePrefix;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_510,pcVar7,&local_511);
    std::operator+(&local_4f0,&local_510,"_read_write");
    pcVar7 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_578,"Read from ",&local_579)
    ;
    std::operator+(&local_558,&local_578,local_3f0);
    std::operator+(&local_538,&local_558," and then write to it");
    pcVar8 = (char *)std::__cxx11::string::c_str();
    SVar1 = init()::configs[(int)target_1._4_4_].storage;
    iVar2 = init()::configs[(int)target_1._4_4_].flags;
    local_598.m_cmds.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_598.m_cmds.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_598.m_cmds.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    anon_unknown_1::InterCallOperations::InterCallOperations(&local_598);
    local_59c = anon_unknown_1::op::ReadZeroData::Generate(1);
    pIVar11 = anon_unknown_1::InterCallOperations::operator<<(&local_598,&local_59c);
    pIVar11 = anon_unknown_1::InterCallOperations::operator<<(pIVar11,&local_59d);
    local_5a8 = anon_unknown_1::op::WriteData::Generate(1,0x7b);
    pIVar11 = anon_unknown_1::InterCallOperations::operator<<(pIVar11,&local_5a8);
    anon_unknown_1::InterCallTestCase::InterCallTestCase
              (pIVar10,pCVar3,pcVar7,pcVar8,SVar1,iVar2,pIVar11);
    local_5a9 = 0;
    tcu::TestNode::addChild(&pTVar5->super_TestNode,(TestNode *)pIVar10);
    anon_unknown_1::InterCallOperations::~InterCallOperations(&local_598);
    std::__cxx11::string::~string((string *)&local_538);
    std::__cxx11::string::~string((string *)&local_558);
    std::__cxx11::string::~string((string *)&local_578);
    std::allocator<char>::~allocator(&local_579);
    std::__cxx11::string::~string((string *)&local_4f0);
    std::__cxx11::string::~string((string *)&local_510);
    std::allocator<char>::~allocator(&local_511);
    pTVar5 = withoutBarrierGroup;
    pIVar10 = (InterCallTestCase *)operator_new(0x108);
    local_699 = 1;
    pCVar3 = (this->super_TestCaseGroup).m_context;
    pcVar7 = init()::configs[(int)target_1._4_4_].namePrefix;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_5f0,pcVar7,&local_5f1);
    std::operator+(&local_5d0,&local_5f0,"_overwrite");
    pcVar7 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_658,"Write to ",&local_659);
    std::operator+(&local_638,&local_658,local_3f0);
    std::operator+(&local_618,&local_638," twice and read it");
    pcVar8 = (char *)std::__cxx11::string::c_str();
    SVar1 = init()::configs[(int)target_1._4_4_].storage;
    iVar2 = init()::configs[(int)target_1._4_4_].flags;
    local_678.m_cmds.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_678.m_cmds.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_678.m_cmds.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    anon_unknown_1::InterCallOperations::InterCallOperations(&local_678);
    local_680 = anon_unknown_1::op::WriteData::Generate(1,0x7b);
    pIVar11 = anon_unknown_1::InterCallOperations::operator<<(&local_678,&local_680);
    pIVar11 = anon_unknown_1::InterCallOperations::operator<<(pIVar11,&local_681);
    local_68c = anon_unknown_1::op::WriteData::Generate(1,0x1c9);
    pIVar11 = anon_unknown_1::InterCallOperations::operator<<(pIVar11,&local_68c);
    pIVar11 = anon_unknown_1::InterCallOperations::operator<<(pIVar11,&local_68d);
    local_698 = anon_unknown_1::op::ReadData::Generate(1,0x1c9);
    pIVar11 = anon_unknown_1::InterCallOperations::operator<<(pIVar11,&local_698);
    anon_unknown_1::InterCallTestCase::InterCallTestCase
              (pIVar10,pCVar3,pcVar7,pcVar8,SVar1,iVar2,pIVar11);
    local_699 = 0;
    tcu::TestNode::addChild(&pTVar5->super_TestNode,(TestNode *)pIVar10);
    anon_unknown_1::InterCallOperations::~InterCallOperations(&local_678);
    std::__cxx11::string::~string((string *)&local_618);
    std::__cxx11::string::~string((string *)&local_638);
    std::__cxx11::string::~string((string *)&local_658);
    std::allocator<char>::~allocator(&local_659);
    std::__cxx11::string::~string((string *)&local_5d0);
    std::__cxx11::string::~string((string *)&local_5f0);
    std::allocator<char>::~allocator(&local_5f1);
    pTVar5 = withoutBarrierGroup;
    pIVar10 = (InterCallTestCase *)operator_new(0x108);
    local_78d = 1;
    pCVar3 = (this->super_TestCaseGroup).m_context;
    pcVar7 = init()::configs[(int)target_1._4_4_].namePrefix;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_6e0,pcVar7,&local_6e1);
    std::operator+(&local_6c0,&local_6e0,"_multiple_write_read");
    pcVar7 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_748,"Write to multiple ",&local_749);
    std::operator+(&local_728,&local_748,local_3f0);
    std::operator+(&local_708,&local_728,"s and read them");
    pcVar8 = (char *)std::__cxx11::string::c_str();
    SVar1 = init()::configs[(int)target_1._4_4_].storage;
    iVar2 = init()::configs[(int)target_1._4_4_].flags;
    local_768.m_cmds.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_768.m_cmds.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_768.m_cmds.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    anon_unknown_1::InterCallOperations::InterCallOperations(&local_768);
    local_770 = anon_unknown_1::op::WriteData::Generate(1,0x7b);
    pIVar11 = anon_unknown_1::InterCallOperations::operator<<(&local_768,&local_770);
    local_778 = anon_unknown_1::op::WriteData::Generate(2,0x1c9);
    pIVar11 = anon_unknown_1::InterCallOperations::operator<<(pIVar11,&local_778);
    pIVar11 = anon_unknown_1::InterCallOperations::operator<<(pIVar11,&local_779);
    RVar13 = anon_unknown_1::op::ReadMultipleData::Generate(1,0x7b,2,0x1c9);
    local_78c = RVar13;
    pIVar11 = anon_unknown_1::InterCallOperations::operator<<(pIVar11,&local_78c);
    anon_unknown_1::InterCallTestCase::InterCallTestCase
              (pIVar10,pCVar3,pcVar7,pcVar8,SVar1,iVar2,pIVar11);
    local_78d = 0;
    tcu::TestNode::addChild(&pTVar5->super_TestNode,(TestNode *)pIVar10);
    anon_unknown_1::InterCallOperations::~InterCallOperations(&local_768);
    std::__cxx11::string::~string((string *)&local_708);
    std::__cxx11::string::~string((string *)&local_728);
    std::__cxx11::string::~string((string *)&local_748);
    std::allocator<char>::~allocator(&local_749);
    std::__cxx11::string::~string((string *)&local_6c0);
    std::__cxx11::string::~string((string *)&local_6e0);
    std::allocator<char>::~allocator(&local_6e1);
    pTVar5 = withoutBarrierGroup;
    pIVar10 = (InterCallTestCase *)operator_new(0x108);
    local_8b9 = 1;
    pCVar3 = (this->super_TestCaseGroup).m_context;
    pcVar7 = init()::configs[(int)target_1._4_4_].namePrefix;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_7d0,pcVar7,&local_7d1);
    std::operator+(&local_7b0,&local_7d0,"_multiple_interleaved_write_read");
    pcVar7 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_838,"Write to same ",&local_839);
    std::operator+(&local_818,&local_838,local_3f0);
    std::operator+(&local_7f8,&local_818," in multiple calls and read it");
    pcVar8 = (char *)std::__cxx11::string::c_str();
    SVar1 = init()::configs[(int)target_1._4_4_].storage;
    iVar2 = init()::configs[(int)target_1._4_4_].flags;
    local_858.m_cmds.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_858.m_cmds.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_858.m_cmds.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    anon_unknown_1::InterCallOperations::InterCallOperations(&local_858);
    WVar14 = anon_unknown_1::op::WriteDataInterleaved::Generate(1,0x7b,true);
    local_878._0_8_ = WVar14._0_8_;
    local_878.evenOdd = WVar14.evenOdd;
    local_868.evenOdd = WVar14.evenOdd;
    local_868._9_3_ = local_878._9_3_;
    local_868._0_8_ = local_878._0_8_;
    pIVar11 = anon_unknown_1::InterCallOperations::operator<<(&local_858,&local_868);
    WVar14 = anon_unknown_1::op::WriteDataInterleaved::Generate(1,0x1c9,false);
    local_898._0_8_ = WVar14._0_8_;
    local_898.evenOdd = WVar14.evenOdd;
    local_888.evenOdd = WVar14.evenOdd;
    local_888._9_3_ = local_898._9_3_;
    local_888._0_8_ = local_898._0_8_;
    pIVar11 = anon_unknown_1::InterCallOperations::operator<<(pIVar11,&local_888);
    pIVar11 = anon_unknown_1::InterCallOperations::operator<<(pIVar11,&local_899);
    RVar15 = anon_unknown_1::op::ReadDataInterleaved::Generate(1,0x7b,0x1c9);
    local_8b8 = RVar15;
    local_8a8 = RVar15;
    pIVar11 = anon_unknown_1::InterCallOperations::operator<<(pIVar11,&local_8a8);
    anon_unknown_1::InterCallTestCase::InterCallTestCase
              (pIVar10,pCVar3,pcVar7,pcVar8,SVar1,iVar2,pIVar11);
    local_8b9 = 0;
    tcu::TestNode::addChild(&pTVar5->super_TestNode,(TestNode *)pIVar10);
    anon_unknown_1::InterCallOperations::~InterCallOperations(&local_858);
    std::__cxx11::string::~string((string *)&local_7f8);
    std::__cxx11::string::~string((string *)&local_818);
    std::__cxx11::string::~string((string *)&local_838);
    std::allocator<char>::~allocator(&local_839);
    std::__cxx11::string::~string((string *)&local_7b0);
    std::__cxx11::string::~string((string *)&local_7d0);
    std::allocator<char>::~allocator(&local_7d1);
    pTVar5 = withoutBarrierGroup;
    pIVar10 = (InterCallTestCase *)operator_new(0x108);
    local_9ad = 1;
    pCVar3 = (this->super_TestCaseGroup).m_context;
    pcVar7 = init()::configs[(int)target_1._4_4_].namePrefix;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_900,pcVar7,&local_901);
    std::operator+(&local_8e0,&local_900,"_multiple_unrelated_write_read_ordered");
    pcVar7 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_968,"Two unrelated ",&local_969);
    std::operator+(&local_948,&local_968,local_3f0);
    std::operator+(&local_928,&local_948," write-reads");
    pcVar8 = (char *)std::__cxx11::string::c_str();
    SVar1 = init()::configs[(int)target_1._4_4_].storage;
    iVar2 = init()::configs[(int)target_1._4_4_].flags;
    local_988.m_cmds.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_988.m_cmds.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_988.m_cmds.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    anon_unknown_1::InterCallOperations::InterCallOperations(&local_988);
    local_990 = anon_unknown_1::op::WriteData::Generate(1,0x7b);
    pIVar11 = anon_unknown_1::InterCallOperations::operator<<(&local_988,&local_990);
    local_998 = anon_unknown_1::op::WriteData::Generate(2,0x1c9);
    pIVar11 = anon_unknown_1::InterCallOperations::operator<<(pIVar11,&local_998);
    pIVar11 = anon_unknown_1::InterCallOperations::operator<<(pIVar11,&local_999);
    local_9a4 = anon_unknown_1::op::ReadData::Generate(1,0x7b);
    pIVar11 = anon_unknown_1::InterCallOperations::operator<<(pIVar11,&local_9a4);
    local_9ac = anon_unknown_1::op::ReadData::Generate(2,0x1c9);
    pIVar11 = anon_unknown_1::InterCallOperations::operator<<(pIVar11,&local_9ac);
    anon_unknown_1::InterCallTestCase::InterCallTestCase
              (pIVar10,pCVar3,pcVar7,pcVar8,SVar1,iVar2,pIVar11);
    local_9ad = 0;
    tcu::TestNode::addChild(&pTVar5->super_TestNode,(TestNode *)pIVar10);
    anon_unknown_1::InterCallOperations::~InterCallOperations(&local_988);
    std::__cxx11::string::~string((string *)&local_928);
    std::__cxx11::string::~string((string *)&local_948);
    std::__cxx11::string::~string((string *)&local_968);
    std::allocator<char>::~allocator(&local_969);
    std::__cxx11::string::~string((string *)&local_8e0);
    std::__cxx11::string::~string((string *)&local_900);
    std::allocator<char>::~allocator(&local_901);
    pTVar5 = withoutBarrierGroup;
    pIVar10 = (InterCallTestCase *)operator_new(0x108);
    callCountNdx._3_1_ = 1;
    pCVar3 = (this->super_TestCaseGroup).m_context;
    pcVar7 = init()::configs[(int)target_1._4_4_].namePrefix;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_9f0,pcVar7,&local_9f1);
    std::operator+(&local_9d0,&local_9f0,"_multiple_unrelated_write_read_non_ordered");
    pcVar7 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a58,"Two unrelated ",&local_a59);
    std::operator+(&local_a38,&local_a58,local_3f0);
    std::operator+(&local_a18,&local_a38," write-reads");
    pcVar8 = (char *)std::__cxx11::string::c_str();
    SVar1 = init()::configs[(int)target_1._4_4_].storage;
    iVar2 = init()::configs[(int)target_1._4_4_].flags;
    local_a78.m_cmds.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a78.m_cmds.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a78.m_cmds.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    anon_unknown_1::InterCallOperations::InterCallOperations(&local_a78);
    local_a80 = anon_unknown_1::op::WriteData::Generate(1,0x7b);
    pIVar11 = anon_unknown_1::InterCallOperations::operator<<(&local_a78,&local_a80);
    local_a88 = anon_unknown_1::op::WriteData::Generate(2,0x1c9);
    pIVar11 = anon_unknown_1::InterCallOperations::operator<<(pIVar11,&local_a88);
    pIVar11 = anon_unknown_1::InterCallOperations::operator<<(pIVar11,&local_a89);
    local_a94 = anon_unknown_1::op::ReadData::Generate(2,0x1c9);
    pIVar11 = anon_unknown_1::InterCallOperations::operator<<(pIVar11,&local_a94);
    _invocationNdx = anon_unknown_1::op::ReadData::Generate(1,0x7b);
    pIVar11 = anon_unknown_1::InterCallOperations::operator<<(pIVar11,(ReadData *)&invocationNdx);
    anon_unknown_1::InterCallTestCase::InterCallTestCase
              (pIVar10,pCVar3,pcVar7,pcVar8,SVar1,iVar2,pIVar11);
    callCountNdx._3_1_ = 0;
    tcu::TestNode::addChild(&pTVar5->super_TestNode,(TestNode *)pIVar10);
    anon_unknown_1::InterCallOperations::~InterCallOperations(&local_a78);
    std::__cxx11::string::~string((string *)&local_a18);
    std::__cxx11::string::~string((string *)&local_a38);
    std::__cxx11::string::~string((string *)&local_a58);
    std::allocator<char>::~allocator(&local_a59);
    std::__cxx11::string::~string((string *)&local_9d0);
    std::__cxx11::string::~string((string *)&local_9f0);
    std::allocator<char>::~allocator(&local_9f1);
    target_1._4_4_ = target_1._4_4_ + 1;
    uVar12 = (ulong)target_1._4_4_;
  }
  local_aa4 = 0;
  while ((int)local_aa4 < 3) {
    for (local_aa8 = 0; pTVar4 = _seed1, local_aa8 < 3; local_aa8 = local_aa8 + 1) {
      this_00 = (SSBOConcurrentAtomicCase *)operator_new(0xa8);
      callCountNdx_1._3_1_ = 1;
      pCVar3 = (this->super_TestCaseGroup).m_context;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b48,"ssbo_atomic_dispatch_",&local_b49);
      de::toString<int>((string *)&invocationNdx_1,init::callCounts + local_aa8);
      std::operator+(&local_b28,&local_b48,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &invocationNdx_1);
      std::operator+(&local_b08,&local_b28,"_calls_");
      std::operator+(&local_ae8,&local_b08,init::ssboInvocations[(int)local_aa4].name);
      std::operator+(&local_ac8,&local_ae8,"_invocations");
      pcVar7 = (char *)std::__cxx11::string::c_str();
      anon_unknown_1::SSBOConcurrentAtomicCase::SSBOConcurrentAtomicCase
                (this_00,pCVar3,pcVar7,"",init::callCounts[local_aa8],
                 init::ssboInvocations[(int)local_aa4].count);
      callCountNdx_1._3_1_ = 0;
      tcu::TestNode::addChild(pTVar4,(TestNode *)this_00);
      std::__cxx11::string::~string((string *)&local_ac8);
      std::__cxx11::string::~string((string *)&local_ae8);
      std::__cxx11::string::~string((string *)&local_b08);
      std::__cxx11::string::~string((string *)&local_b28);
      std::__cxx11::string::~string((string *)&invocationNdx_1);
      std::__cxx11::string::~string((string *)&local_b48);
      std::allocator<char>::~allocator(&local_b49);
    }
    local_aa4 = local_aa4 + 1;
    uVar12 = (ulong)local_aa4;
  }
  local_b78 = 0;
  while ((int)local_b78 < 3) {
    for (local_b7c = 0; pTVar4 = _seed1, local_b7c < 3; local_b7c = local_b7c + 1) {
      this_01 = (ConcurrentImageAtomicCase *)operator_new(0xb8);
      callCountNdx_2._3_1_ = 1;
      pCVar3 = (this->super_TestCaseGroup).m_context;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c20,"image_atomic_dispatch_",&local_c21);
      de::toString<int>((string *)&invocationNdx_2,init::callCounts + local_b7c);
      std::operator+(&local_c00,&local_c20,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &invocationNdx_2);
      std::operator+(&local_be0,&local_c00,"_calls_");
      std::operator+(&local_bc0,&local_be0,init::imageInvocations[(int)local_b78].name);
      std::operator+(&local_ba0,&local_bc0,"_invocations");
      pcVar7 = (char *)std::__cxx11::string::c_str();
      anon_unknown_1::ConcurrentImageAtomicCase::ConcurrentImageAtomicCase
                (this_01,pCVar3,pcVar7,"",init::callCounts[local_b7c],
                 init::imageInvocations[(int)local_b78].count);
      callCountNdx_2._3_1_ = 0;
      tcu::TestNode::addChild(pTVar4,(TestNode *)this_01);
      std::__cxx11::string::~string((string *)&local_ba0);
      std::__cxx11::string::~string((string *)&local_bc0);
      std::__cxx11::string::~string((string *)&local_be0);
      std::__cxx11::string::~string((string *)&local_c00);
      std::__cxx11::string::~string((string *)&invocationNdx_2);
      std::__cxx11::string::~string((string *)&local_c20);
      std::allocator<char>::~allocator(&local_c21);
    }
    local_b78 = local_b78 + 1;
    uVar12 = (ulong)local_b78;
  }
  local_c50 = 0;
  while ((int)local_c50 < 3) {
    for (local_c54 = 0; pTVar4 = _seed1, local_c54 < 3; local_c54 = local_c54 + 1) {
      this_02 = (ConcurrentAtomicCounterCase *)operator_new(0x98);
      callCountNdx_3._3_1_ = 1;
      pCVar3 = (this->super_TestCaseGroup).m_context;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_cf8,"atomic_counter_dispatch_",&local_cf9);
      de::toString<int>((string *)&invocationNdx_3,init::callCounts + local_c54);
      std::operator+(&local_cd8,&local_cf8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &invocationNdx_3);
      std::operator+(&local_cb8,&local_cd8,"_calls_");
      std::operator+(&local_c98,&local_cb8,init::counterInvocations[(int)local_c50].name);
      std::operator+(&local_c78,&local_c98,"_invocations");
      pcVar7 = (char *)std::__cxx11::string::c_str();
      anon_unknown_1::ConcurrentAtomicCounterCase::ConcurrentAtomicCounterCase
                (this_02,pCVar3,pcVar7,"",init::callCounts[local_c54],
                 init::counterInvocations[(int)local_c50].count);
      callCountNdx_3._3_1_ = 0;
      tcu::TestNode::addChild(pTVar4,(TestNode *)this_02);
      std::__cxx11::string::~string((string *)&local_c78);
      std::__cxx11::string::~string((string *)&local_c98);
      std::__cxx11::string::~string((string *)&local_cb8);
      std::__cxx11::string::~string((string *)&local_cd8);
      std::__cxx11::string::~string((string *)&invocationNdx_3);
      std::__cxx11::string::~string((string *)&local_cf8);
      std::allocator<char>::~allocator(&local_cf9);
    }
    local_c50 = local_c50 + 1;
    uVar12 = (ulong)local_c50;
  }
  local_d28 = 0;
  while ((int)local_d28 < 3) {
    for (local_d2c = 0; pTVar4 = _seed1, local_d2c < 3; local_d2c = local_d2c + 1) {
      this_03 = (ConcurrentSSBOAtomicCounterMixedCase *)operator_new(0x98);
      pCVar3 = (this->super_TestCaseGroup).m_context;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_dd0,"ssbo_atomic_counter_mixed_dispatch_",&local_dd1);
      de::toString<int>(&local_df8,init::callCounts + local_d2c);
      std::operator+(&local_db0,&local_dd0,&local_df8);
      std::operator+(&local_d90,&local_db0,"_calls_");
      std::operator+(&local_d70,&local_d90,init::counterInvocations[(int)local_d28].name);
      std::operator+(&local_d50,&local_d70,"_invocations");
      pcVar7 = (char *)std::__cxx11::string::c_str();
      anon_unknown_1::ConcurrentSSBOAtomicCounterMixedCase::ConcurrentSSBOAtomicCounterMixedCase
                (this_03,pCVar3,pcVar7,"",init::callCounts[local_d2c],
                 init::counterInvocations[(int)local_d28].count);
      tcu::TestNode::addChild(pTVar4,(TestNode *)this_03);
      std::__cxx11::string::~string((string *)&local_d50);
      std::__cxx11::string::~string((string *)&local_d70);
      std::__cxx11::string::~string((string *)&local_d90);
      std::__cxx11::string::~string((string *)&local_db0);
      std::__cxx11::string::~string((string *)&local_df8);
      std::__cxx11::string::~string((string *)&local_dd0);
      std::allocator<char>::~allocator(&local_dd1);
    }
    local_d28 = local_d28 + 1;
    uVar12 = (ulong)local_d28;
  }
  return (int)uVar12;
}

Assistant:

void SynchronizationTests::init (void)
{
	tcu::TestCaseGroup* const inInvocationGroup		= new tcu::TestCaseGroup(m_testCtx, "in_invocation",	"Test intra-invocation synchronization");
	tcu::TestCaseGroup* const interInvocationGroup	= new tcu::TestCaseGroup(m_testCtx, "inter_invocation", "Test inter-invocation synchronization");
	tcu::TestCaseGroup* const interCallGroup		= new tcu::TestCaseGroup(m_testCtx, "inter_call",       "Test inter-call synchronization");

	addChild(inInvocationGroup);
	addChild(interInvocationGroup);
	addChild(interCallGroup);

	// .in_invocation & .inter_invocation
	{
		static const struct CaseConfig
		{
			const char*									namePrefix;
			const InterInvocationTestCase::StorageType	storage;
			const int									flags;
		} configs[] =
		{
			{ "image",			InterInvocationTestCase::STORAGE_IMAGE,		0										},
			{ "image_atomic",	InterInvocationTestCase::STORAGE_IMAGE,		InterInvocationTestCase::FLAG_ATOMIC	},
			{ "ssbo",			InterInvocationTestCase::STORAGE_BUFFER,	0										},
			{ "ssbo_atomic",	InterInvocationTestCase::STORAGE_BUFFER,	InterInvocationTestCase::FLAG_ATOMIC	},
		};

		for (int groupNdx = 0; groupNdx < 2; ++groupNdx)
		{
			tcu::TestCaseGroup* const	targetGroup	= (groupNdx == 0) ? (inInvocationGroup) : (interInvocationGroup);
			const int					extraFlags	= (groupNdx == 0) ? (0) : (InterInvocationTestCase::FLAG_IN_GROUP);

			for (int configNdx = 0; configNdx < DE_LENGTH_OF_ARRAY(configs); ++configNdx)
			{
				const char* const target = (configs[configNdx].storage == InterInvocationTestCase::STORAGE_BUFFER) ? ("buffer") : ("image");

				targetGroup->addChild(new InvocationWriteReadCase(m_context,
																  (std::string(configs[configNdx].namePrefix) + "_write_read").c_str(),
																  (std::string("Write to ") + target + " and read it").c_str(),
																  configs[configNdx].storage,
																  configs[configNdx].flags | extraFlags));

				targetGroup->addChild(new InvocationReadWriteCase(m_context,
																  (std::string(configs[configNdx].namePrefix) + "_read_write").c_str(),
																  (std::string("Read form ") + target + " and then write to it").c_str(),
																  configs[configNdx].storage,
																  configs[configNdx].flags | extraFlags));

				targetGroup->addChild(new InvocationOverWriteCase(m_context,
																  (std::string(configs[configNdx].namePrefix) + "_overwrite").c_str(),
																  (std::string("Write to ") + target + " twice and read it").c_str(),
																  configs[configNdx].storage,
																  configs[configNdx].flags | extraFlags));

				targetGroup->addChild(new InvocationAliasWriteCase(m_context,
																   (std::string(configs[configNdx].namePrefix) + "_alias_write").c_str(),
																   (std::string("Write to aliasing ") + target + " and read it").c_str(),
																   InvocationAliasWriteCase::TYPE_WRITE,
																   configs[configNdx].storage,
																   configs[configNdx].flags | extraFlags));

				targetGroup->addChild(new InvocationAliasWriteCase(m_context,
																   (std::string(configs[configNdx].namePrefix) + "_alias_overwrite").c_str(),
																   (std::string("Write to aliasing ") + target + "s and read it").c_str(),
																   InvocationAliasWriteCase::TYPE_OVERWRITE,
																   configs[configNdx].storage,
																   configs[configNdx].flags | extraFlags));
			}
		}
	}

	// .inter_call
	{
		tcu::TestCaseGroup* const withBarrierGroup		= new tcu::TestCaseGroup(m_testCtx, "with_memory_barrier", "Synchronize with memory barrier");
		tcu::TestCaseGroup* const withoutBarrierGroup	= new tcu::TestCaseGroup(m_testCtx, "without_memory_barrier", "Synchronize without memory barrier");

		interCallGroup->addChild(withBarrierGroup);
		interCallGroup->addChild(withoutBarrierGroup);

		// .with_memory_barrier
		{
			static const struct CaseConfig
			{
				const char*								namePrefix;
				const InterCallTestCase::StorageType	storage;
				const int								flags;
			} configs[] =
			{
				{ "image",			InterCallTestCase::STORAGE_IMAGE,	0																		},
				{ "image_atomic",	InterCallTestCase::STORAGE_IMAGE,	InterCallTestCase::FLAG_USE_ATOMIC | InterCallTestCase::FLAG_USE_INT	},
				{ "ssbo",			InterCallTestCase::STORAGE_BUFFER,	0																		},
				{ "ssbo_atomic",	InterCallTestCase::STORAGE_BUFFER,	InterCallTestCase::FLAG_USE_ATOMIC | InterCallTestCase::FLAG_USE_INT	},
			};

			const int seed0 = 123;
			const int seed1 = 457;

			for (int configNdx = 0; configNdx < DE_LENGTH_OF_ARRAY(configs); ++configNdx)
			{
				const char* const target = (configs[configNdx].storage == InterCallTestCase::STORAGE_BUFFER) ? ("buffer") : ("image");

				withBarrierGroup->addChild(new InterCallTestCase(m_context,
																 (std::string(configs[configNdx].namePrefix) + "_write_read").c_str(),
																 (std::string("Write to ") + target + " and read it").c_str(),
																 configs[configNdx].storage,
																 configs[configNdx].flags,
																 InterCallOperations()
																	<< op::WriteData::Generate(1, seed0)
																	<< op::Barrier()
																	<< op::ReadData::Generate(1, seed0)));

				withBarrierGroup->addChild(new InterCallTestCase(m_context,
																 (std::string(configs[configNdx].namePrefix) + "_read_write").c_str(),
																 (std::string("Read from ") + target + " and then write to it").c_str(),
																 configs[configNdx].storage,
																 configs[configNdx].flags,
																 InterCallOperations()
																	<< op::ReadZeroData::Generate(1)
																	<< op::Barrier()
																	<< op::WriteData::Generate(1, seed0)));

				withBarrierGroup->addChild(new InterCallTestCase(m_context,
																 (std::string(configs[configNdx].namePrefix) + "_overwrite").c_str(),
																 (std::string("Write to ") + target + " twice and read it").c_str(),
																 configs[configNdx].storage,
																 configs[configNdx].flags,
																 InterCallOperations()
																	<< op::WriteData::Generate(1, seed0)
																	<< op::Barrier()
																	<< op::WriteData::Generate(1, seed1)
																	<< op::Barrier()
																	<< op::ReadData::Generate(1, seed1)));

				withBarrierGroup->addChild(new InterCallTestCase(m_context,
																 (std::string(configs[configNdx].namePrefix) + "_multiple_write_read").c_str(),
																 (std::string("Write to multiple ") + target + "s and read them").c_str(),
																 configs[configNdx].storage,
																 configs[configNdx].flags,
																 InterCallOperations()
																	<< op::WriteData::Generate(1, seed0)
																	<< op::WriteData::Generate(2, seed1)
																	<< op::Barrier()
																	<< op::ReadMultipleData::Generate(1, seed0, 2, seed1)));

				withBarrierGroup->addChild(new InterCallTestCase(m_context,
																 (std::string(configs[configNdx].namePrefix) + "_multiple_interleaved_write_read").c_str(),
																 (std::string("Write to same ") + target + " in multiple calls and read it").c_str(),
																 configs[configNdx].storage,
																 configs[configNdx].flags,
																 InterCallOperations()
																	<< op::WriteDataInterleaved::Generate(1, seed0, true)
																	<< op::WriteDataInterleaved::Generate(1, seed1, false)
																	<< op::Barrier()
																	<< op::ReadDataInterleaved::Generate(1, seed0, seed1)));

				withBarrierGroup->addChild(new InterCallTestCase(m_context,
																 (std::string(configs[configNdx].namePrefix) + "_multiple_unrelated_write_read_ordered").c_str(),
																 (std::string("Two unrelated ") + target + " write-reads").c_str(),
																 configs[configNdx].storage,
																 configs[configNdx].flags,
																 InterCallOperations()
																	<< op::WriteData::Generate(1, seed0)
																	<< op::WriteData::Generate(2, seed1)
																	<< op::Barrier()
																	<< op::ReadData::Generate(1, seed0)
																	<< op::ReadData::Generate(2, seed1)));

				withBarrierGroup->addChild(new InterCallTestCase(m_context,
																 (std::string(configs[configNdx].namePrefix) + "_multiple_unrelated_write_read_non_ordered").c_str(),
																 (std::string("Two unrelated ") + target + " write-reads").c_str(),
																 configs[configNdx].storage,
																 configs[configNdx].flags,
																 InterCallOperations()
																	<< op::WriteData::Generate(1, seed0)
																	<< op::WriteData::Generate(2, seed1)
																	<< op::Barrier()
																	<< op::ReadData::Generate(2, seed1)
																	<< op::ReadData::Generate(1, seed0)));
			}

			// .without_memory_barrier
			{
				struct InvocationConfig
				{
					const char*	name;
					int			count;
				};

				static const InvocationConfig ssboInvocations[] =
				{
					{ "1k",		1024	},
					{ "4k",		4096	},
					{ "32k",	32768	},
				};
				static const InvocationConfig imageInvocations[] =
				{
					{ "8x8",		8	},
					{ "32x32",		32	},
					{ "128x128",	128	},
				};
				static const InvocationConfig counterInvocations[] =
				{
					{ "32",		32		},
					{ "128",	128		},
					{ "1k",		1024	},
				};
				static const int callCounts[] = { 2, 5, 100 };

				for (int invocationNdx = 0; invocationNdx < DE_LENGTH_OF_ARRAY(ssboInvocations); ++invocationNdx)
					for (int callCountNdx = 0; callCountNdx < DE_LENGTH_OF_ARRAY(callCounts); ++callCountNdx)
						withoutBarrierGroup->addChild(new SSBOConcurrentAtomicCase(m_context, (std::string("ssbo_atomic_dispatch_") + de::toString(callCounts[callCountNdx]) + "_calls_" + ssboInvocations[invocationNdx].name + "_invocations").c_str(),	"", callCounts[callCountNdx], ssboInvocations[invocationNdx].count));

				for (int invocationNdx = 0; invocationNdx < DE_LENGTH_OF_ARRAY(imageInvocations); ++invocationNdx)
					for (int callCountNdx = 0; callCountNdx < DE_LENGTH_OF_ARRAY(callCounts); ++callCountNdx)
						withoutBarrierGroup->addChild(new ConcurrentImageAtomicCase(m_context, (std::string("image_atomic_dispatch_") + de::toString(callCounts[callCountNdx]) + "_calls_" + imageInvocations[invocationNdx].name + "_invocations").c_str(),	"", callCounts[callCountNdx], imageInvocations[invocationNdx].count));

				for (int invocationNdx = 0; invocationNdx < DE_LENGTH_OF_ARRAY(counterInvocations); ++invocationNdx)
					for (int callCountNdx = 0; callCountNdx < DE_LENGTH_OF_ARRAY(callCounts); ++callCountNdx)
						withoutBarrierGroup->addChild(new ConcurrentAtomicCounterCase(m_context, (std::string("atomic_counter_dispatch_") + de::toString(callCounts[callCountNdx]) + "_calls_" + counterInvocations[invocationNdx].name + "_invocations").c_str(),	"", callCounts[callCountNdx], counterInvocations[invocationNdx].count));

				for (int invocationNdx = 0; invocationNdx < DE_LENGTH_OF_ARRAY(counterInvocations); ++invocationNdx)
					for (int callCountNdx = 0; callCountNdx < DE_LENGTH_OF_ARRAY(callCounts); ++callCountNdx)
						withoutBarrierGroup->addChild(new ConcurrentSSBOAtomicCounterMixedCase(m_context, (std::string("ssbo_atomic_counter_mixed_dispatch_") + de::toString(callCounts[callCountNdx]) + "_calls_" + counterInvocations[invocationNdx].name + "_invocations").c_str(),	"", callCounts[callCountNdx], counterInvocations[invocationNdx].count));
			}
		}
	}
}